

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

_Bool ts_subtree_has_trailing_empty_descendant(Subtree self,Subtree other)

{
  Subtree self_00;
  _Bool _Var1;
  uint32_t uVar2;
  Subtree child;
  uint i;
  Subtree other_local;
  Subtree self_local;
  
  child._4_4_ = ts_subtree_child_count(self);
  while( true ) {
    child._4_4_ = child._4_4_ - 1;
    if (child._4_4_ == -1) {
      return false;
    }
    self_00 = ((self.ptr)->field_17).field_0.children[(uint)child._4_4_];
    uVar2 = ts_subtree_total_bytes(self_00);
    if (uVar2 != 0) break;
    if ((self_00.ptr == other.ptr) ||
       (_Var1 = ts_subtree_has_trailing_empty_descendant(self_00,other), _Var1)) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool ts_subtree_has_trailing_empty_descendant(Subtree self, Subtree other) {
  for (unsigned i = ts_subtree_child_count(self) - 1; i + 1 > 0; i--) {
    Subtree child = self.ptr->children[i];
    if (ts_subtree_total_bytes(child) > 0) break;
    if (child.ptr == other.ptr || ts_subtree_has_trailing_empty_descendant(child, other)) {
      return true;
    }
  }
  return false;
}